

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O1

void unroll(lua_State *L,void *ud)

{
  byte *pbVar1;
  ushort uVar2;
  CallInfo *ci;
  int iVar3;
  StkId oldtop;
  ushort uVar4;
  uint status;
  
  ci = L->ci;
  while (ci != &L->base_ci) {
    uVar2 = ci->callstatus;
    if ((uVar2 & 2) == 0) {
      luaV_finishOp(L);
      luaV_execute(L,ci);
    }
    else {
      if ((uVar2 >> 9 & 1) == 0) {
        status = 1;
        if ((uVar2 & 0x10) != 0) {
          uVar4 = uVar2 >> 10 & 7;
          status = 1;
          if (uVar4 != 0) {
            status = (uint)uVar4;
            iVar3 = (ci->u2).funcidx;
            L->allowhook = (byte)uVar2 & 1;
            oldtop = luaF_close(L,(StkId)((long)iVar3 + (long)(L->stack).p),status,1);
            luaD_seterrorobj(L,(uint)uVar4,oldtop);
            luaD_shrinkstack(L);
            pbVar1 = (byte *)((long)&ci->callstatus + 1);
            *pbVar1 = *pbVar1 & 0xe3;
          }
          *(byte *)&ci->callstatus = (byte)ci->callstatus & 0xef;
          L->errfunc = (ci->u).c.old_errfunc;
        }
        if ((L->ci->top).p < (L->top).p) {
          (L->ci->top).p = (L->top).p;
        }
        iVar3 = (*(ci->u).c.k)(L,status,(ci->u).c.ctx);
      }
      else {
        iVar3 = (ci->u2).funcidx;
      }
      luaD_poscall(L,ci,iVar3);
    }
    ci = L->ci;
  }
  return;
}

Assistant:

static void unroll (lua_State *L, void *ud) {
  CallInfo *ci;
  UNUSED(ud);
  while ((ci = L->ci) != &L->base_ci) {  /* something in the stack */
    if (!isLua(ci))  /* C function? */
      finishCcall(L, ci);  /* complete its execution */
    else {  /* Lua function */
      luaV_finishOp(L);  /* finish interrupted instruction */
      luaV_execute(L, ci);  /* execute down to higher C 'boundary' */
    }
  }
}